

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::SSBOLayoutCase::compareTypes
          (SSBOLayoutCase *this,BufferLayout *refLayout,BufferLayout *cmpLayout)

{
  pointer pBVar1;
  int iVar2;
  _Alloc_hider __s;
  pointer pBVar3;
  pointer pBVar4;
  uint uVar5;
  size_t sVar6;
  ostream *poVar7;
  char *pcVar8;
  bool bVar9;
  int *piVar10;
  ostringstream instanceName;
  int local_398;
  allocator<char> local_391;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_390;
  BufferLayout *local_388;
  int local_380;
  int local_37c;
  BufferLayout *local_378;
  long *local_370 [2];
  long local_360 [2];
  ulong local_350;
  SSBOLayoutCase *local_348;
  ulong local_340;
  BufferBlock *local_338;
  vector<int,_std::allocator<int>_> *local_330;
  undefined1 local_328 [8];
  _func_int **local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [6];
  ios_base local_2b0 [264];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  uVar5 = (uint)((ulong)((long)(this->m_interface).m_bufferBlocks.
                               super__Vector_base<deqp::gles31::bb::BufferBlock_*,_std::allocator<deqp::gles31::bb::BufferBlock_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_interface).m_bufferBlocks.
                              super__Vector_base<deqp::gles31::bb::BufferBlock_*,_std::allocator<deqp::gles31::bb::BufferBlock_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((int)uVar5 < 1) {
    bVar9 = true;
  }
  else {
    local_390 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    local_350 = (ulong)(uVar5 & 0x7fffffff);
    bVar9 = true;
    local_340 = 0;
    local_388 = cmpLayout;
    local_378 = refLayout;
    local_348 = this;
    do {
      local_338 = (local_348->m_interface).m_bufferBlocks.
                  super__Vector_base<deqp::gles31::bb::BufferBlock_*,_std::allocator<deqp::gles31::bb::BufferBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_340];
      local_37c = local_338->m_arraySize;
      local_380 = 1;
      if (1 < local_37c) {
        local_380 = local_37c;
      }
      if (local_37c < 1) {
        local_380 = 1;
      }
      local_398 = 0;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        __s._M_p = (local_338->m_blockName)._M_dataplus._M_p;
        if (__s._M_p == (char *)0x0) {
          std::ios::clear((int)&local_398 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x1f0);
        }
        else {
          sVar6 = strlen(__s._M_p);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s._M_p,sVar6);
        }
        if (0 < local_37c) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
          poVar7 = (ostream *)std::ostream::operator<<((ostringstream *)local_1a8,local_398);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_328,(char *)local_370[0],&local_391);
        uVar5 = bb::BufferLayout::getBlockIndex(local_388,(string *)local_328);
        if (local_328 != (undefined1  [8])local_318) {
          operator_delete((void *)local_328,local_318[0]._M_allocated_capacity + 1);
        }
        if (local_370[0] != local_360) {
          operator_delete(local_370[0],local_360[0] + 1);
        }
        if (-1 < (int)uVar5) {
          pBVar3 = (local_388->blocks).
                   super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar10 = *(int **)&pBVar3[uVar5].activeVarIndices.
                              super__Vector_base<int,_std::allocator<int>_>;
          if (piVar10 !=
              *(pointer *)
               ((long)&pBVar3[uVar5].activeVarIndices.super__Vector_base<int,_std::allocator<int>_>
               + 8)) {
            local_330 = &pBVar3[uVar5].activeVarIndices;
            do {
              iVar2 = *piVar10;
              pBVar4 = (local_388->bufferVars).
                       super__Vector_base<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_328,pBVar4[iVar2].name._M_dataplus._M_p,
                         (allocator<char> *)local_370);
              uVar5 = bb::BufferLayout::getVariableIndex(local_378,(string *)local_328);
              if (local_328 != (undefined1  [8])local_318) {
                operator_delete((void *)local_328,local_318[0]._M_allocated_capacity + 1);
              }
              pBVar4 = pBVar4 + iVar2;
              if ((int)uVar5 < 0) {
                local_328 = (undefined1  [8])local_390;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_320,"Error: Buffer variable \'",0x18);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_320,(pBVar4->name)._M_dataplus._M_p,
                           (pBVar4->name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_320,"\' not found in reference layout",0x1f);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
LAB_016bfeb9:
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
                std::ios_base::~ios_base(local_2b0);
                bVar9 = false;
              }
              else {
                pBVar1 = (local_378->bufferVars).
                         super__Vector_base<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar5;
                if (pBVar1->type != pBVar4->type) {
                  local_328 = (undefined1  [8])local_390;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_320,"Error: Buffer variable type mismatch in \'",0x29
                            );
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_320,(pBVar1->name)._M_dataplus._M_p,
                             (pBVar1->name)._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_320,"\':\n",3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_320,"  expected: ",0xc);
                  pcVar8 = glu::getDataTypeName(pBVar1->type);
                  iVar2 = (int)(ostringstream *)&local_320;
                  if (pcVar8 == (char *)0x0) {
                    std::ios::clear(iVar2 + (int)local_320[-3]);
                  }
                  else {
                    sVar6 = strlen(pcVar8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_320,pcVar8,sVar6);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_320,"  got: ",7);
                  pcVar8 = glu::getDataTypeName(pBVar4->type);
                  if (pcVar8 == (char *)0x0) {
                    std::ios::clear(iVar2 + (int)local_320[-3]);
                  }
                  else {
                    sVar6 = strlen(pcVar8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_320,pcVar8,sVar6);
                  }
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_328,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
                  std::ios_base::~ios_base(local_2b0);
                  bVar9 = false;
                }
                if (pBVar1->arraySize < pBVar4->arraySize) {
                  local_328 = (undefined1  [8])local_390;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_320,"Error: Invalid array size in \'",0x1e);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_320,(pBVar1->name)._M_dataplus._M_p,
                             (pBVar1->name)._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_320,"\': expected <= ",0xf);
                  std::ostream::operator<<((ostringstream *)&local_320,pBVar1->arraySize);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_328,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
                  std::ios_base::~ios_base(local_2b0);
                  bVar9 = false;
                }
                if (pBVar1->topLevelArraySize < pBVar4->topLevelArraySize) {
                  local_328 = (undefined1  [8])local_390;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_320,"Error: Invalid top-level array size in \'",0x28)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_320,(pBVar1->name)._M_dataplus._M_p,
                             (pBVar1->name)._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_320,"\': expected <= ",0xf);
                  std::ostream::operator<<((ostringstream *)&local_320,pBVar1->topLevelArraySize);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_328,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  goto LAB_016bfeb9;
                }
              }
              piVar10 = piVar10 + 1;
            } while (piVar10 !=
                     *(pointer *)
                      ((long)&(local_330->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 8
                      ));
          }
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        local_398 = local_398 + 1;
      } while (local_398 != local_380);
      local_340 = local_340 + 1;
    } while (local_340 != local_350);
  }
  return bVar9;
}

Assistant:

bool SSBOLayoutCase::compareTypes (const BufferLayout& refLayout, const BufferLayout& cmpLayout) const
{
	TestLog&	log			= m_testCtx.getLog();
	bool		isOk		= true;
	int			numBlocks	= m_interface.getNumBlocks();

	for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		const BufferBlock&		block			= m_interface.getBlock(blockNdx);
		bool					isArray			= block.isArray();
		int						numInstances	= isArray ? block.getArraySize() : 1;

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			std::ostringstream instanceName;

			instanceName << block.getBlockName();
			if (isArray)
				instanceName << "[" << instanceNdx << "]";

			int cmpBlockNdx = cmpLayout.getBlockIndex(instanceName.str().c_str());

			if (cmpBlockNdx < 0)
				continue;

			const BlockLayoutEntry& cmpBlockLayout = cmpLayout.blocks[cmpBlockNdx];

			for (vector<int>::const_iterator ndxIter = cmpBlockLayout.activeVarIndices.begin(); ndxIter != cmpBlockLayout.activeVarIndices.end(); ndxIter++)
			{
				const BufferVarLayoutEntry&	cmpEntry	= cmpLayout.bufferVars[*ndxIter];
				int							refEntryNdx	= refLayout.getVariableIndex(cmpEntry.name.c_str());

				if (refEntryNdx < 0)
				{
					log << TestLog::Message << "Error: Buffer variable '" << cmpEntry.name << "' not found in reference layout" << TestLog::EndMessage;
					isOk = false;
					continue;
				}

				const BufferVarLayoutEntry&	refEntry	= refLayout.bufferVars[refEntryNdx];

				if (refEntry.type != cmpEntry.type)
				{
					log << TestLog::Message << "Error: Buffer variable type mismatch in '" << refEntry.name << "':\n"
						<< "  expected: " << glu::getDataTypeName(refEntry.type) << "\n"
						<< "  got: " << glu::getDataTypeName(cmpEntry.type)
						<< TestLog::EndMessage;
					isOk = false;
				}

				if (refEntry.arraySize < cmpEntry.arraySize)
				{
					log << TestLog::Message << "Error: Invalid array size in '" << refEntry.name << "': expected <= " << refEntry.arraySize << TestLog::EndMessage;
					isOk = false;
				}

				if (refEntry.topLevelArraySize < cmpEntry.topLevelArraySize)
				{
					log << TestLog::Message << "Error: Invalid top-level array size in '" << refEntry.name << "': expected <= " << refEntry.topLevelArraySize << TestLog::EndMessage;
					isOk = false;
				}
			}
		}
	}

	return isOk;
}